

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int received_key_update(quicly_conn_t *conn,uint64_t newly_decrypted_key_phase)

{
  st_quicly_application_space_t *psVar1;
  int iVar2;
  
  psVar1 = conn->application;
  if (newly_decrypted_key_phase <= (psVar1->cipher).ingress.key_phase.decrypted) {
    __assert_fail("space->cipher.ingress.key_phase.decrypted < newly_decrypted_key_phase",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                  ,0x5ea,"int received_key_update(quicly_conn_t *, uint64_t)");
  }
  if (newly_decrypted_key_phase <= (psVar1->cipher).ingress.key_phase.prepared) {
    (psVar1->cipher).ingress.key_phase.decrypted = newly_decrypted_key_phase;
    if ((psVar1->cipher).egress.key_phase < newly_decrypted_key_phase) {
      iVar2 = update_1rtt_egress_key(conn);
      return iVar2;
    }
    return 0;
  }
  __assert_fail("newly_decrypted_key_phase <= space->cipher.ingress.key_phase.prepared",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                ,0x5eb,"int received_key_update(quicly_conn_t *, uint64_t)");
}

Assistant:

static int received_key_update(quicly_conn_t *conn, uint64_t newly_decrypted_key_phase)
{
    struct st_quicly_application_space_t *space = conn->application;

    assert(space->cipher.ingress.key_phase.decrypted < newly_decrypted_key_phase);
    assert(newly_decrypted_key_phase <= space->cipher.ingress.key_phase.prepared);

    space->cipher.ingress.key_phase.decrypted = newly_decrypted_key_phase;

    QUICLY_PROBE(CRYPTO_RECEIVE_KEY_UPDATE, conn, conn->stash.now, space->cipher.ingress.key_phase.decrypted,
                 QUICLY_PROBE_HEXDUMP(space->cipher.ingress.secret, ptls_get_cipher(conn->crypto.tls)->hash->digest_size));

    if (space->cipher.egress.key_phase < space->cipher.ingress.key_phase.decrypted) {
        return update_1rtt_egress_key(conn);
    } else {
        return 0;
    }
}